

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup_p.h
# Opt level: O0

void __thiscall QDnsLookupPrivate::nameserverPortChanged(QDnsLookupPrivate *this)

{
  QDnsLookupPrivate *in_RDI;
  quint16 _t1;
  
  q_func(in_RDI);
  _t1 = (quint16)((ulong)in_RDI >> 0x30);
  QObjectBindableProperty::operator_cast_to_unsigned_short
            ((QObjectBindableProperty<QDnsLookupPrivate,_unsigned_short,_&QDnsLookupPrivate::_qt_property_port_offset,_&QDnsLookupPrivate::nameserverPortChanged>
              *)0x345730);
  QDnsLookup::nameserverPortChanged((QDnsLookup *)0x34573d,_t1);
  return;
}

Assistant:

void nameserverPortChanged()
    {
        emit q_func()->nameserverPortChanged(port);
    }